

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2mps.cpp
# Opt level: O0

void __thiscall MPS::add_field(MPS *this,char *str)

{
  char cVar1;
  int iVar2;
  runtime_error *this_00;
  int local_128;
  int i;
  char local_118 [8];
  char _error_msg_ [256];
  char *str_local;
  MPS *this_local;
  
  if (6 < this->cur_field) {
    _error_msg_._248_8_ = str;
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "cur_field < NFIELDS",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2mps.cpp"
             ,0x26);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->p = field_start[this->cur_field];
  for (local_128 = 0; str[local_128] != '\0'; local_128 = local_128 + 1) {
    cVar1 = str[local_128];
    iVar2 = this->p;
    this->p = iVar2 + 1;
    this->buf[iVar2] = cVar1;
  }
  this->cur_field = this->cur_field + 1;
  return;
}

Assistant:

void add_field(const char *str) {
		throw_assert(cur_field < NFIELDS);
		p = field_start[cur_field];
		for (int i = 0; str[i]; i++) {
			buf[p++] = str[i];
		}
		cur_field++;
	}